

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl.h
# Opt level: O0

size_t flatbuffers::SizeOf(BaseType t)

{
  size_t sStack_10;
  BaseType t_local;
  
  switch(t) {
  case BASE_TYPE_NONE:
    sStack_10 = 1;
    break;
  case BASE_TYPE_UTYPE:
    sStack_10 = 1;
    break;
  case BASE_TYPE_BOOL:
    sStack_10 = 1;
    break;
  case BASE_TYPE_CHAR:
    sStack_10 = 1;
    break;
  case BASE_TYPE_UCHAR:
    sStack_10 = 1;
    break;
  case BASE_TYPE_SHORT:
    sStack_10 = 2;
    break;
  case BASE_TYPE_USHORT:
    sStack_10 = 2;
    break;
  case BASE_TYPE_INT:
    sStack_10 = 4;
    break;
  case BASE_TYPE_UINT:
    sStack_10 = 4;
    break;
  case BASE_TYPE_LONG:
    sStack_10 = 8;
    break;
  case BASE_TYPE_ULONG:
    sStack_10 = 8;
    break;
  case BASE_TYPE_FLOAT:
    sStack_10 = 4;
    break;
  case BASE_TYPE_DOUBLE:
    sStack_10 = 8;
    break;
  case BASE_TYPE_STRING:
    sStack_10 = 4;
    break;
  case BASE_TYPE_VECTOR:
    sStack_10 = 4;
    break;
  case BASE_TYPE_STRUCT:
    sStack_10 = 4;
    break;
  case BASE_TYPE_UNION:
    sStack_10 = 4;
    break;
  case BASE_TYPE_ARRAY:
    sStack_10 = 4;
    break;
  case BASE_TYPE_VECTOR64:
    sStack_10 = 8;
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/idl.h"
                  ,0x9f,"size_t flatbuffers::SizeOf(const BaseType)");
  }
  return sStack_10;
}

Assistant:

inline size_t SizeOf(const BaseType t) {
  switch (t) {
  #define FLATBUFFERS_TD(ENUM, IDLTYPE, CTYPE, ...) \
    case BASE_TYPE_##ENUM: return sizeof(CTYPE);
      FLATBUFFERS_GEN_TYPES(FLATBUFFERS_TD)
  #undef FLATBUFFERS_TD
    default: FLATBUFFERS_ASSERT(0);
  }
  return 0;
}